

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O3

REF_STATUS ref_smooth_geom_face(REF_GRID ref_grid,REF_INT node)

{
  REF_NODE pRVar1;
  REF_GEOM ref_geom;
  REF_INTERP pRVar2;
  REF_ADJ pRVar3;
  REF_DBL *pRVar4;
  REF_ADAPT pRVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  undefined8 uVar12;
  ulong uVar13;
  char *pcVar14;
  bool bVar15;
  REF_INT id;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL qtet;
  REF_BOOL geom_face;
  REF_BOOL geom_edge;
  REF_BOOL geom_node;
  REF_DBL qtri;
  REF_DBL uv [2];
  REF_DBL normdev;
  REF_DBL normdev_orig;
  REF_DBL min_uv_area;
  REF_DBL qtri_orig;
  REF_DBL uv_max [2];
  REF_DBL uv_min [2];
  REF_DBL uv_ideal [2];
  REF_DBL uv_orig [2];
  REF_DBL qtet_orig;
  int local_13c;
  REF_INT local_134;
  double local_130;
  double local_128;
  REF_DBL local_120;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  double local_108;
  REF_DBL local_100;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  double dStack_e0;
  long local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  REF_DBL local_38;
  
  pRVar1 = ref_grid->node;
  ref_geom = ref_grid->geom;
  local_100 = 0.0;
  local_120 = 0.0;
  pRVar2 = ref_grid->interp;
  if ((-1 < node) &&
     (((((pRVar3 = ref_grid->cell[6]->ref_adj, node < pRVar3->nnode &&
         (pRVar3->first[(uint)node] != -1)) ||
        ((pRVar3 = ref_grid->cell[10]->ref_adj, node < pRVar3->nnode &&
         (pRVar3->first[(uint)node] != -1)))) ||
       ((pRVar3 = ref_grid->cell[9]->ref_adj, node < pRVar3->nnode &&
        (pRVar3->first[(uint)node] != -1)))) ||
      ((pRVar3 = ref_grid->cell[0xb]->ref_adj, node < pRVar3->nnode &&
       (pRVar3->first[(uint)node] != -1)))))) {
    return 0;
  }
  uVar8 = ref_geom_is_a(ref_geom,node,0,&local_10c);
  if (uVar8 == 0) {
    uVar8 = ref_geom_is_a(ref_geom,node,1,&local_110);
    if (uVar8 == 0) {
      uVar8 = ref_geom_is_a(ref_geom,node,2,&local_114);
      if (uVar8 == 0) {
        bVar15 = true;
        if ((-1 < node) && (pRVar3 = ref_grid->cell[6]->ref_adj, node < pRVar3->nnode)) {
          bVar15 = pRVar3->first[(uint)node] == -1;
        }
        if (local_10c != 0) {
          pcVar14 = "geom node not allowed";
          uVar12 = 0x6b7;
LAB_001ac6d7:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 uVar12,"ref_smooth_geom_face",pcVar14);
          return 1;
        }
        if (local_110 != 0) {
          pcVar14 = "geom edge not allowed";
          uVar12 = 0x6b8;
          goto LAB_001ac6d7;
        }
        if (local_114 == 0) {
          pcVar14 = "geom face required";
          uVar12 = 0x6b9;
          goto LAB_001ac6d7;
        }
        if (!bVar15) {
          pcVar14 = "quads not allowed";
          uVar12 = 0x6ba;
          goto LAB_001ac6d7;
        }
        uVar8 = ref_geom_unique_id(ref_geom,node,2,&local_134);
        if (uVar8 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x6bd,"ref_smooth_geom_face",(ulong)uVar8,"get-id");
          ref_clump_around(ref_grid,node,"get-id.tec");
          return uVar8;
        }
        uVar8 = ref_geom_tuv(ref_geom,node,2,local_134,&local_78);
        if (uVar8 == 0) {
          if ((ref_grid->surf == 0) &&
             (uVar8 = ref_smooth_tet_quality_around(ref_grid,node,&local_38), uVar8 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x6c5,"ref_smooth_geom_face",(ulong)uVar8,"q tet");
            pRVar4 = pRVar1->real;
            lVar11 = (long)(node * 0xf);
            printf(" %f %f %f\n",pRVar4[lVar11],pRVar4[lVar11 + 1],pRVar4[lVar11 + 2]);
            return uVar8;
          }
          uVar8 = ref_smooth_tri_quality_around(ref_grid,node,&local_b0);
          if (uVar8 == 0) {
            uVar8 = ref_smooth_tri_normdev_around(ref_grid,node,&local_c0);
            if (uVar8 == 0) {
              uVar8 = ref_smooth_tri_ratio_around(ref_grid,node,&local_128,&local_130);
              if (uVar8 == 0) {
                bVar15 = false;
                local_108 = local_b0;
                if ((0.5 < local_b0) && (0.5 < local_128)) {
                  bVar15 = local_130 < 2.0;
                }
                local_13c = -1;
                if ((pRVar2 != (REF_INTERP)0x0) && (pRVar2->continuously != 0)) {
                  local_13c = pRVar2->cell[node];
                }
                if (bVar15) {
                  uVar8 = ref_smooth_tri_pliant_uv(ref_grid,node,&local_88);
                  if (uVar8 == 0) {
LAB_001aca1b:
                    uVar8 = ref_geom_tri_uv_bounding_box(ref_grid,node,&local_98,&local_a8);
                    if (uVar8 == 0) {
                      local_58 = local_c0;
                      uStack_50 = 0;
                      local_68 = local_c0 * 0.9;
                      uStack_60 = 0;
                      local_48 = local_108 * 0.9;
                      uStack_40 = 0;
                      local_d0 = (long)node;
                      local_118 = 8;
                      uVar8 = 0;
                      local_f8 = 1.0;
                      uStack_f0 = 0;
                      while( true ) {
                        local_e8 = local_f8 * local_88 + (1.0 - local_f8) * local_78;
                        dStack_e0 = local_f8 * dStack_80 + (1.0 - local_f8) * dStack_70;
                        uVar9 = ref_geom_add(ref_geom,node,2,local_134,&local_e8);
                        if (uVar9 != 0) break;
                        uVar9 = ref_geom_constrain(ref_grid,node);
                        if (uVar9 != 0) {
                          uVar13 = (ulong)uVar9;
                          pcVar14 = "constrain";
                          uVar12 = 0x6e5;
                          goto LAB_001acf49;
                        }
                        uVar9 = ref_metric_interpolate_node(ref_grid,node);
                        if ((uVar9 != 0) && (uVar9 != 5)) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,0x6e7,"ref_smooth_geom_face",(ulong)uVar9,
                                 "ref_metric_interpolate_node failed");
                          uVar8 = uVar9;
                        }
                        if ((uVar9 != 5) && (uVar9 != 0)) {
                          return uVar8;
                        }
                        if (ref_grid->surf == 0) {
                          uVar10 = ref_smooth_tet_quality_around(ref_grid,node,&local_120);
                          if (uVar10 == 0) {
                            uVar10 = ref_smooth_tet_ratio_around
                                               (ref_grid,node,&local_128,&local_130);
                            if (uVar10 == 0) goto LAB_001acbe9;
                            uVar13 = (ulong)uVar10;
                            pcVar14 = "ratio";
                            uVar12 = 0x6f0;
                          }
                          else {
                            uVar13 = (ulong)uVar10;
                            pcVar14 = "q tet";
                            uVar12 = 0x6ee;
                          }
                          goto LAB_001acf49;
                        }
                        local_120 = 1.0;
                        uVar10 = ref_smooth_tri_ratio_around(ref_grid,node,&local_128,&local_130);
                        if (uVar10 != 0) {
                          uVar13 = (ulong)uVar10;
                          pcVar14 = "ratio";
                          uVar12 = 0x6ec;
                          goto LAB_001acf49;
                        }
LAB_001acbe9:
                        uVar10 = ref_smooth_tri_quality_around(ref_grid,node,&local_100);
                        if (uVar10 != 0) {
                          uVar13 = (ulong)uVar10;
                          pcVar14 = "q tri";
                          uVar12 = 0x6f2;
                          goto LAB_001acf49;
                        }
                        uVar10 = ref_smooth_tri_normdev_around(ref_grid,node,&local_c8);
                        if (uVar10 != 0) {
                          uVar13 = (ulong)uVar10;
                          pcVar14 = "nd";
                          uVar12 = 0x6f3;
                          goto LAB_001acf49;
                        }
                        uVar10 = ref_smooth_tri_uv_area_around(ref_grid,node,&local_b8);
                        if (uVar10 != 0) {
                          uVar13 = (ulong)uVar10;
                          pcVar14 = "a";
                          uVar12 = 0x6f4;
                          goto LAB_001acf49;
                        }
                        if (uVar9 == 0) {
                          pRVar5 = ref_grid->adapt;
                          bVar6 = false;
                          if ((pRVar5->post_min_normdev < local_c8 || local_58 < local_c8) &&
                             (bVar6 = false, local_68 < local_c8)) {
                            pRVar4 = &pRVar1->min_uv_area;
                            if (local_b8 < *pRVar4 || local_b8 == *pRVar4) goto LAB_001acc42;
                            bVar6 = false;
                            if ((((local_98 < local_e8) && (local_e8 < local_a8)) &&
                                (bVar6 = false, local_90 < dStack_e0)) && (dStack_e0 < local_a0)) {
                              if ((local_120 < pRVar5->smooth_min_quality ||
                                   local_120 == pRVar5->smooth_min_quality) ||
                                 (local_128 < pRVar5->post_min_ratio)) goto LAB_001acc42;
                              bVar6 = local_130 <= pRVar5->post_max_ratio;
                            }
                          }
                        }
                        else {
LAB_001acc42:
                          bVar6 = false;
                        }
                        if (bVar15) {
                          bVar7 = 0.4 < local_100 && local_48 < local_100;
                        }
                        else {
                          bVar7 = local_108 < local_100;
                        }
                        if ((bool)(bVar6 & bVar7)) {
                          return 0;
                        }
                        local_f8 = local_f8 * 0.5;
                        if (uVar9 != 0 && local_13c != -1) {
                          pRVar2->cell[local_d0] = local_13c;
                        }
                        local_118 = local_118 + -1;
                        if (local_118 == 0) {
                          uVar9 = ref_geom_add(ref_geom,node,2,local_134,&local_78);
                          if (uVar9 == 0) {
                            uVar9 = ref_geom_constrain(ref_grid,node);
                            if (uVar9 == 0) {
                              uVar9 = ref_metric_interpolate_node(ref_grid,node);
                              if ((uVar9 != 0) && (uVar9 != 5)) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                       ,0x712,"ref_smooth_geom_face",(ulong)uVar9,"interp");
                                uVar8 = uVar9;
                              }
                              if (uVar9 == 5) {
                                return 0;
                              }
                              if (uVar9 == 0) {
                                return 0;
                              }
                              return uVar8;
                            }
                            pcVar14 = "constrain";
                            uVar12 = 0x711;
                          }
                          else {
                            pcVar14 = "set t";
                            uVar12 = 0x710;
                          }
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,uVar12,"ref_smooth_geom_face",(ulong)uVar9,pcVar14);
                          return uVar9;
                        }
                      }
                      uVar13 = (ulong)uVar9;
                      pcVar14 = "set uv";
                      uVar12 = 0x6e4;
LAB_001acf49:
                      uVar8 = (uint)uVar13;
                      goto LAB_001ac648;
                    }
                    pcVar14 = "bb";
                    uVar12 = 0x6dd;
                  }
                  else {
                    pcVar14 = "ideal";
                    uVar12 = 0x6d8;
                  }
                }
                else {
                  uVar8 = ref_smooth_tri_weighted_ideal_uv(ref_grid,node,&local_88);
                  if (uVar8 == 0) goto LAB_001aca1b;
                  pcVar14 = "ideal";
                  uVar12 = 0x6da;
                }
              }
              else {
                pcVar14 = "ratio";
                uVar12 = 0x6ca;
              }
            }
            else {
              pcVar14 = "nd_orig";
              uVar12 = 0x6c8;
            }
          }
          else {
            pcVar14 = "q tri";
            uVar12 = 0x6c7;
          }
        }
        else {
          pcVar14 = "get uv_orig";
          uVar12 = 0x6be;
        }
      }
      else {
        pcVar14 = "face check";
        uVar12 = 0x6b5;
      }
    }
    else {
      pcVar14 = "edge check";
      uVar12 = 0x6b4;
    }
  }
  else {
    pcVar14 = "node check";
    uVar12 = 0x6b3;
  }
  uVar13 = (ulong)uVar8;
LAB_001ac648:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar12,
         "ref_smooth_geom_face",uVar13,pcVar14);
  return uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_geom_face(REF_GRID ref_grid, REF_INT node) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_BOOL geom_node, geom_edge, geom_face, no_quads;
  REF_INT id;
  REF_DBL uv_orig[2], uv_ideal[2];
  REF_DBL qtet_orig, qtri_orig;
  REF_DBL qtri = 0.0, qtet = 0.0, min_uv_area, min_ratio, max_ratio;
  REF_DBL normdev_orig, normdev;
  REF_DBL backoff, uv[2];
  REF_INT tries, iuv;
  REF_DBL uv_min[2], uv_max[2];
  REF_STATUS interp_status;
  REF_INT interp_guess;
  REF_INTERP ref_interp = ref_grid_interp(ref_grid);
  REF_BOOL pliant_smoothing = REF_FALSE;
  REF_BOOL accept;

  REF_BOOL verbose = REF_FALSE;

  if (!ref_cell_node_empty(ref_grid_qua(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_pri(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_pyr(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_hex(ref_grid), node)) return REF_SUCCESS;

  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &geom_node), "node check");
  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &geom_edge), "edge check");
  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_FACE, &geom_face), "face check");
  no_quads = ref_cell_node_empty(ref_grid_qua(ref_grid), node);
  RAS(!geom_node, "geom node not allowed");
  RAS(!geom_edge, "geom edge not allowed");
  RAS(geom_face, "geom face required");
  RAS(no_quads, "quads not allowed");

  RSB(ref_geom_unique_id(ref_geom, node, REF_GEOM_FACE, &id), "get-id",
      ref_clump_around(ref_grid, node, "get-id.tec"));
  RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_FACE, id, uv_orig), "get uv_orig");
  if (ref_grid_surf(ref_grid)) {
    qtet_orig = 1.0;
  } else {
    RSB(ref_smooth_tet_quality_around(ref_grid, node, &qtet_orig), "q tet", {
      printf(" %f %f %f\n", ref_node_xyz(ref_node, 0, node),
             ref_node_xyz(ref_node, 1, node), ref_node_xyz(ref_node, 2, node));
    });
  }
  RSS(ref_smooth_tri_quality_around(ref_grid, node, &qtri_orig), "q tri");
  RSS(ref_smooth_tri_normdev_around(ref_grid, node, &normdev_orig), "nd_orig");
  RSS(ref_smooth_tri_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
      "ratio");
  pliant_smoothing = (qtri_orig > 0.5 && min_ratio > 0.5 && max_ratio < 2.0);
  interp_guess = REF_EMPTY;
  if (NULL != ref_interp) {
    if (ref_interp_continuously(ref_interp)) {
      interp_guess = ref_interp_cell(ref_interp, node);
    }
  }

  if (verbose)
    printf("uv %f %f tri %f tet %f\n", uv_orig[0], uv_orig[1], qtri_orig,
           qtet_orig);

  if (pliant_smoothing) {
    RSS(ref_smooth_tri_pliant_uv(ref_grid, node, uv_ideal), "ideal");
  } else {
    RSS(ref_smooth_tri_weighted_ideal_uv(ref_grid, node, uv_ideal), "ideal");
  }

  RSS(ref_geom_tri_uv_bounding_box(ref_grid, node, uv_min, uv_max), "bb");

  backoff = 1.0;
  for (tries = 0; tries < 8; tries++) {
    for (iuv = 0; iuv < 2; iuv++)
      uv[iuv] = backoff * uv_ideal[iuv] + (1.0 - backoff) * uv_orig[iuv];

    RSS(ref_geom_add(ref_geom, node, REF_GEOM_FACE, id, uv), "set uv");
    RSS(ref_geom_constrain(ref_grid, node), "constrain");
    interp_status = ref_metric_interpolate_node(ref_grid, node);
    RXS(interp_status, REF_NOT_FOUND, "ref_metric_interpolate_node failed");

    if (ref_grid_surf(ref_grid)) {
      qtet = 1.0;
      RSS(ref_smooth_tri_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
          "ratio");
    } else {
      RSS(ref_smooth_tet_quality_around(ref_grid, node, &qtet), "q tet");
      RSS(ref_smooth_tet_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
          "ratio");
    }
    RSS(ref_smooth_tri_quality_around(ref_grid, node, &qtri), "q tri");
    RSS(ref_smooth_tri_normdev_around(ref_grid, node, &normdev), "nd");
    RSS(ref_smooth_tri_uv_area_around(ref_grid, node, &min_uv_area), "a");

    accept = (REF_SUCCESS == interp_status);
    accept = accept && (normdev > ref_grid_adapt(ref_grid, post_min_normdev) ||
                        normdev > normdev_orig);
    accept = accept && (normdev > 0.9 * normdev_orig);
    accept = accept && (min_uv_area > ref_node_min_uv_area(ref_node));
    accept = accept && (uv_min[0] < uv[0]) && (uv[0] < uv_max[0]);
    accept = accept && (uv_min[1] < uv[1]) && (uv[1] < uv_max[1]);
    accept = accept && (qtet > ref_grid_adapt(ref_grid, smooth_min_quality));
    accept = accept && (min_ratio >= ref_grid_adapt(ref_grid, post_min_ratio));
    accept = accept && (max_ratio <= ref_grid_adapt(ref_grid, post_max_ratio));
    if (pliant_smoothing) {
      accept = accept && (qtri > 0.9 * qtri_orig);
      accept = accept && (qtri > 0.4);
    } else {
      accept = accept && (qtri > qtri_orig);
    }

    if (accept) {
      if (verbose) printf("better qtri %f qtet %f\n", qtri, qtet);
      return REF_SUCCESS;
    }
    backoff *= 0.5;
    if (REF_EMPTY != interp_guess && REF_SUCCESS != interp_status)
      ref_interp_cell(ref_interp, node) = interp_guess;
  }

  RSS(ref_geom_add(ref_geom, node, REF_GEOM_FACE, id, uv_orig), "set t");
  RSS(ref_geom_constrain(ref_grid, node), "constrain");
  RXS(ref_metric_interpolate_node(ref_grid, node), REF_NOT_FOUND, "interp");

  if (verbose)
    printf("undo qtri %f qtet %f was %f %f\n", qtri, qtet, qtri_orig,
           qtet_orig);

  return REF_SUCCESS;
}